

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::setEnabled_helper(QWidgetPrivate *this,bool enable)

{
  undefined1 *puVar1;
  QWidgetData **ppQVar2;
  QWidget *this_00;
  QWidgetPrivate *this_01;
  long lVar3;
  QWidget *pQVar4;
  bool bVar5;
  char cVar6;
  ulong uVar7;
  QWidgetData *pQVar8;
  undefined8 uVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  QWidget *pQVar13;
  undefined7 in_register_00000031;
  int int_off;
  long lVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QWidgetData **local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar8 = this_00->data;
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    uVar10 = pQVar8->widget_attributes;
    if ((((byte)uVar10 ^ enable) & 1) != 0) goto LAB_002fed9e;
    if (enable) goto LAB_002feba5;
    pQVar8->widget_attributes = uVar10 | 1;
    pQVar13 = this_00;
    do {
      puVar1 = &pQVar13->field_0x8;
      pQVar4 = *(QWidget **)(*(long *)puVar1 + 0x10);
      if (pQVar4 == (QWidget *)0x0) break;
      ppQVar2 = &pQVar13->data;
      pQVar13 = pQVar4;
    } while ((((*ppQVar2)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
    lVar14 = 0x7ffffff;
    if ((*(QWidget **)(*(long *)puVar1 + 0x90) == this_00) &&
       (((lVar12 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar12 != 0 &&
         ((*(byte *)(*(long *)(lVar12 + 0x20) + 8) & 1) != 0)) ||
        (cVar6 = (**(code **)(*(long *)this_00 + 0x198))(this_00), cVar6 == '\0')))) {
      QWidget::clearFocus(this_00);
    }
  }
  else {
    if ((((((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
         (lVar14 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar14 != 0)) &&
        ((*(byte *)(*(long *)(lVar14 + 0x20) + 8) & 1) != 0)) ||
       (uVar10 = pQVar8->widget_attributes, (((byte)uVar10 ^ enable) & 1) != 0)) goto LAB_002fed9e;
LAB_002feba5:
    pQVar8->widget_attributes = uVar10 & 0xfffffffe;
    lVar14 = 0;
  }
  local_50 = &this_00->field_0x8;
  local_58 = &this_00->data;
  uVar7 = *(ulong *)&this->field_0x28;
  if (uVar7 != 0) {
    uVar15 = 0;
    do {
      lVar12 = *(long *)(*(long *)&this->field_0x20 + uVar15 * 8);
      if ((lVar12 != 0) &&
         (this_01 = *(QWidgetPrivate **)(lVar12 + 8), (this_01->field_0x30 & 1) != 0)) {
        if (enable) {
          puVar11 = this_01->high_attributes + lVar14;
        }
        else {
          puVar11 = (uint *)(*(long *)(lVar12 + 0x20) + 8);
        }
        if ((*puVar11 & 1) == 0) {
          setEnabled_helper(this_01,enable);
          uVar7 = *(ulong *)&this->field_0x28;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar7);
  }
  if (((*(byte *)(*(long *)local_50 + 0x240) & 0x40) != 0) ||
     (pQVar8 = *local_58,
     ((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    qt_qpa_set_cursor(this_00,false);
    pQVar8 = this_00->data;
  }
  if (((pQVar8->widget_attributes & 0x4000) != 0) && (bVar5 = QWidget::hasFocus(this_00), bVar5)) {
    lVar14 = *(long *)&this->field_0x8;
    lVar12 = *(long *)(*(long *)(lVar14 + 8) + 0x78);
    if ((lVar12 != 0) &&
       ((*(long *)(lVar12 + 0x30) != 0 && (*(int *)(*(long *)(lVar12 + 0x30) + 4) != 0)))) {
      while (lVar3 = *(long *)(lVar12 + 0x38), lVar3 != 0) {
        lVar12 = *(long *)(*(long *)(lVar3 + 8) + 0x78);
        lVar14 = lVar3;
        if (((lVar12 == 0) || (*(long *)(lVar12 + 0x30) == 0)) ||
           (*(int *)(*(long *)(lVar12 + 0x30) + 4) == 0)) break;
      }
    }
    if (enable) {
      if ((*(byte *)(*(long *)(lVar14 + 0x20) + 9) & 0x40) == 0) goto LAB_002fed6e;
    }
    else {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
    }
    uVar9 = QGuiApplication::inputMethod();
    QInputMethod::update(uVar9,1);
  }
LAB_002fed6e:
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,EnabledChange);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
  QEvent::~QEvent((QEvent *)&local_48);
LAB_002fed9e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setEnabled_helper(bool enable)
{
    Q_Q(QWidget);

    if (enable && !q->isWindow() && q->parentWidget() && !q->parentWidget()->isEnabled())
        return; // nothing we can do

    if (enable != q->testAttribute(Qt::WA_Disabled))
        return; // nothing to do

    q->setAttribute(Qt::WA_Disabled, !enable);
    updateSystemBackground();

    if (!enable && q->window()->focusWidget() == q) {
        bool parentIsEnabled = (!q->parentWidget() || q->parentWidget()->isEnabled());
        if (!parentIsEnabled || !q->focusNextChild())
            q->clearFocus();
    }

    Qt::WidgetAttribute attribute = enable ? Qt::WA_ForceDisabled : Qt::WA_Disabled;
    for (int i = 0; i < children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(children.at(i));
        if (w && !w->testAttribute(attribute))
            w->d_func()->setEnabled_helper(enable);
    }
#ifndef QT_NO_CURSOR
    if (q->testAttribute(Qt::WA_SetCursor) || q->isWindow()) {
        // enforce the windows behavior of clearing the cursor on
        // disabled widgets
        qt_qpa_set_cursor(q, false);
    }
#endif
#ifndef QT_NO_IM
    if (q->testAttribute(Qt::WA_InputMethodEnabled) && q->hasFocus()) {
        QWidget *focusWidget = effectiveFocusWidget();

        if (enable) {
            if (focusWidget->testAttribute(Qt::WA_InputMethodEnabled))
                QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        } else {
            QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
    }
#endif //QT_NO_IM
    QEvent e(QEvent::EnabledChange);
    QCoreApplication::sendEvent(q, &e);
}